

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *wrk,
             number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec)

{
  uint *puVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  cpp_dec_float<100U,_int,_void> *pcVar5;
  long lVar6;
  long lVar7;
  cpp_dec_float<100U,_int,_void> *pcVar8;
  cpp_dec_float<100U,_int,_void> *pcVar9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<100U,_int,_void> local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  long local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  lVar6 = (long)this->thedim;
  local_98 = wrk;
  if (0 < lVar6) {
    do {
      iVar2 = (this->row).orig[lVar6 + -1];
      pcVar9 = &vec[iVar2].m_backend;
      pcVar5 = &(this->diag).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend;
      iVar2 = (this->col).orig[lVar6 + -1];
      local_e8.fpclass = cpp_dec_float_finite;
      local_e8.prec_elem = 0x10;
      local_e8.data._M_elems[0] = 0;
      local_e8.data._M_elems[1] = 0;
      local_e8.data._M_elems[2] = 0;
      local_e8.data._M_elems[3] = 0;
      local_e8.data._M_elems[4] = 0;
      local_e8.data._M_elems[5] = 0;
      local_e8.data._M_elems[6] = 0;
      local_e8.data._M_elems[7] = 0;
      local_e8.data._M_elems[8] = 0;
      local_e8.data._M_elems[9] = 0;
      local_e8.data._M_elems[10] = 0;
      local_e8.data._M_elems[0xb] = 0;
      local_e8.data._M_elems[0xc] = 0;
      local_e8.data._M_elems[0xd] = 0;
      local_e8.data._M_elems._56_5_ = 0;
      local_e8.data._M_elems[0xf]._1_3_ = 0;
      local_e8.exp = 0;
      local_e8.neg = false;
      pcVar8 = pcVar5;
      if ((&local_e8 != pcVar9) && (pcVar8 = pcVar9, &local_e8 != pcVar5)) {
        local_e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar5->data)._M_elems;
        local_e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 2);
        local_e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 4);
        local_e8.data._M_elems._24_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 6);
        local_e8.data._M_elems._32_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 8);
        local_e8.data._M_elems._40_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 10);
        local_e8.data._M_elems._48_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 0xc);
        uVar3 = *(undefined8 *)((pcVar5->data)._M_elems + 0xe);
        local_e8.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_e8.exp = pcVar5->exp;
        local_e8.neg = pcVar5->neg;
        local_e8.fpclass = pcVar5->fpclass;
        local_e8.prec_elem = pcVar5->prec_elem;
      }
      local_90 = lVar6;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_e8,pcVar8);
      *(undefined8 *)local_98[iVar2].m_backend.data._M_elems = local_e8.data._M_elems._0_8_;
      *(undefined8 *)(local_98[iVar2].m_backend.data._M_elems + 2) = local_e8.data._M_elems._8_8_;
      puVar1 = local_98[iVar2].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_e8.data._M_elems._24_8_;
      puVar1 = local_98[iVar2].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = local_e8.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_e8.data._M_elems._40_8_;
      puVar1 = local_98[iVar2].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = local_e8.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_e8.data._M_elems[0xf]._1_3_,local_e8.data._M_elems._56_5_);
      local_98[iVar2].m_backend.exp = local_e8.exp;
      local_98[iVar2].m_backend.neg = local_e8.neg;
      local_98[iVar2].m_backend.fpclass = local_e8.fpclass;
      local_98[iVar2].m_backend.prec_elem = local_e8.prec_elem;
      local_88.data._M_elems[0xf]._1_3_ = local_e8.data._M_elems[0xf]._1_3_;
      local_88.data._M_elems._56_5_ = local_e8.data._M_elems._56_5_;
      local_88.data._M_elems[0xc] = local_e8.data._M_elems[0xc];
      local_88.data._M_elems[0xd] = local_e8.data._M_elems[0xd];
      local_88.data._M_elems[8] = local_e8.data._M_elems[8];
      local_88.data._M_elems[9] = local_e8.data._M_elems[9];
      local_88.data._M_elems[10] = local_e8.data._M_elems[10];
      local_88.data._M_elems[0xb] = local_e8.data._M_elems[0xb];
      local_88.data._M_elems[4] = local_e8.data._M_elems[4];
      local_88.data._M_elems[5] = local_e8.data._M_elems[5];
      local_88.data._M_elems[6] = local_e8.data._M_elems[6];
      local_88.data._M_elems[7] = local_e8.data._M_elems[7];
      local_88.data._M_elems[0] = local_e8.data._M_elems[0];
      local_88.data._M_elems[1] = local_e8.data._M_elems[1];
      local_88.data._M_elems[2] = local_e8.data._M_elems[2];
      local_88.data._M_elems[3] = local_e8.data._M_elems[3];
      local_88.exp = local_e8.exp;
      local_88.neg = local_e8.neg;
      local_88.fpclass = local_e8.fpclass;
      local_88.prec_elem = local_e8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)pcVar9,0.0);
      if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_003ea02a:
        if (0 < (this->u).col.len[iVar2]) {
          lVar7 = (long)(this->u).col.start[iVar2];
          lVar6 = lVar7 * 0x50;
          do {
            pcVar8 = (cpp_dec_float<100U,_int,_void> *)
                     ((long)(((this->u).col.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar6);
            local_e8.fpclass = cpp_dec_float_finite;
            local_e8.prec_elem = 0x10;
            local_e8.data._M_elems[0] = 0;
            local_e8.data._M_elems[1] = 0;
            local_e8.data._M_elems[2] = 0;
            local_e8.data._M_elems[3] = 0;
            local_e8.data._M_elems[4] = 0;
            local_e8.data._M_elems[5] = 0;
            local_e8.data._M_elems[6] = 0;
            local_e8.data._M_elems[7] = 0;
            local_e8.data._M_elems[8] = 0;
            local_e8.data._M_elems[9] = 0;
            local_e8.data._M_elems[10] = 0;
            local_e8.data._M_elems[0xb] = 0;
            local_e8.data._M_elems[0xc] = 0;
            local_e8.data._M_elems[0xd] = 0;
            local_e8.data._M_elems._56_5_ = 0;
            local_e8.data._M_elems[0xf]._1_3_ = 0;
            local_e8.exp = 0;
            local_e8.neg = false;
            pcVar9 = &local_88;
            if (pcVar8 != &local_e8) {
              local_e8.data._M_elems[0xc] = local_88.data._M_elems[0xc];
              local_e8.data._M_elems[0xd] = local_88.data._M_elems[0xd];
              local_e8.data._M_elems._56_5_ = local_88.data._M_elems._56_5_;
              local_e8.data._M_elems[0xf]._1_3_ = local_88.data._M_elems[0xf]._1_3_;
              local_e8.data._M_elems[8] = local_88.data._M_elems[8];
              local_e8.data._M_elems[9] = local_88.data._M_elems[9];
              local_e8.data._M_elems[10] = local_88.data._M_elems[10];
              local_e8.data._M_elems[0xb] = local_88.data._M_elems[0xb];
              local_e8.data._M_elems[4] = local_88.data._M_elems[4];
              local_e8.data._M_elems[5] = local_88.data._M_elems[5];
              local_e8.data._M_elems[6] = local_88.data._M_elems[6];
              local_e8.data._M_elems[7] = local_88.data._M_elems[7];
              local_e8.data._M_elems[0] = local_88.data._M_elems[0];
              local_e8.data._M_elems[1] = local_88.data._M_elems[1];
              local_e8.data._M_elems[2] = local_88.data._M_elems[2];
              local_e8.data._M_elems[3] = local_88.data._M_elems[3];
              local_e8.exp = local_88.exp;
              local_e8.neg = local_88.neg;
              local_e8.prec_elem = local_88.prec_elem;
              local_e8.fpclass = local_88.fpclass;
              pcVar9 = pcVar8;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_e8,pcVar9);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&vec[(this->u).col.idx[lVar7]].m_backend,&local_e8);
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 0x50;
          } while (lVar7 < (long)(this->u).col.len[iVar2] + (long)(this->u).col.start[iVar2]);
        }
      }
      else {
        local_e8.fpclass = cpp_dec_float_finite;
        local_e8.prec_elem = 0x10;
        local_e8.data._M_elems[0] = 0;
        local_e8.data._M_elems[1] = 0;
        local_e8.data._M_elems[2] = 0;
        local_e8.data._M_elems[3] = 0;
        local_e8.data._M_elems[4] = 0;
        local_e8.data._M_elems[5] = 0;
        local_e8.data._M_elems[6] = 0;
        local_e8.data._M_elems[7] = 0;
        local_e8.data._M_elems[8] = 0;
        local_e8.data._M_elems[9] = 0;
        local_e8.data._M_elems[10] = 0;
        local_e8.data._M_elems[0xb] = 0;
        local_e8.data._M_elems[0xc] = 0;
        local_e8.data._M_elems[0xd] = 0;
        local_e8.data._M_elems._56_5_ = 0;
        local_e8.data._M_elems[0xf]._1_3_ = 0;
        local_e8.exp = 0;
        local_e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_e8,0.0);
        iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&local_88,&local_e8);
        if (iVar4 != 0) goto LAB_003ea02a;
      }
      lVar6 = local_90 + -1;
    } while (1 < local_90);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUright(R* wrk, R* vec) const
{

   for(int i = thedim - 1; i >= 0; i--)
   {
      int  r = row.orig[i];
      int  c = col.orig[i];
      R x = wrk[c] = diag[r] * vec[r];

      vec[r] = 0.0;

      if(x != 0.0)
         //if (isNotZero(x))
      {
         for(int j = u.col.start[c]; j < u.col.start[c] + u.col.len[c]; j++)
            vec[u.col.idx[j]] -= x * u.col.val[j];
      }
   }
}